

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O3

void __thiscall HighsSearch::installNode(HighsSearch *this,OpenNode *node)

{
  double dVar1;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var2;
  int *piVar3;
  pointer pHVar4;
  pointer pdVar5;
  int *piVar6;
  pointer pHVar7;
  long lVar8;
  void *local_30;
  shared_ptr<const_StabilizerOrbits> local_28;
  
  HighsDomain::setDomainChangeStack(&this->localdom,&node->domchgstack,&node->branchings);
  _Var2._M_head_impl =
       (this->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  local_28.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       ((_Var2._M_head_impl)->globalOrbits).
       super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_28.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    piVar6 = (this->localdom).branchPos_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->localdom).branchPos_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar6 != piVar3) {
      pHVar4 = (this->localdom).domchgstack_.
               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        lVar8 = (long)pHVar4[*piVar6].column;
        if ((*(int *)(*(long *)&((vector<int,_std::allocator<int>_> *)
                                ((long)&(_Var2._M_head_impl)->symmetries + 0x60))->
                                super__Vector_base<int,_std::allocator<int>_> + lVar8 * 4) != -1) &&
           (((((*(char *)(*(long *)&((*(HighsMipSolver **)
                                       ((long)&(_Var2._M_head_impl)->domain + 0x1d8))->model_->
                                    integrality_).
                                    super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                         + lVar8) == '\0' ||
               (dVar1 = *(double *)
                         (*(long *)&((vector<double,_std::allocator<double>_> *)
                                    ((long)&(_Var2._M_head_impl)->domain + 0x308))->
                                    super__Vector_base<double,_std::allocator<double>_> + lVar8 * 8)
               , dVar1 != 0.0)) || (NAN(dVar1))) ||
             ((dVar1 = *(double *)
                        (*(long *)&((vector<double,_std::allocator<double>_> *)
                                   ((long)&(_Var2._M_head_impl)->domain + 800))->
                                   super__Vector_base<double,_std::allocator<double>_> + lVar8 * 8),
              dVar1 != 1.0 || (NAN(dVar1))))) ||
            ((pHVar7 = pHVar4 + *piVar6, pHVar7->boundtype == kLower &&
             ((dVar1 = pHVar7->boundval, dVar1 == 1.0 && (!NAN(dVar1))))))))) {
          local_28.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_28.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          goto LAB_002e2b9f;
        }
        piVar6 = piVar6 + 1;
      } while (piVar6 != piVar3);
    }
  }
  local_28.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(_Var2._M_head_impl)->globalOrbits + 8))->_M_pi;
  if (local_28.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_28.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_28.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
LAB_002e2b9f:
  local_30 = (void *)0x0;
  std::vector<HighsSearch::NodeData,std::allocator<HighsSearch::NodeData>>::
  emplace_back<double&,double&,decltype(nullptr),std::shared_ptr<StabilizerOrbits_const>>
            ((vector<HighsSearch::NodeData,std::allocator<HighsSearch::NodeData>> *)&this->nodestack
             ,&node->lower_bound,&node->estimate,&local_30,&local_28);
  if (local_28.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pdVar5 = (this->subrootsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->subrootsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar5) {
    (this->subrootsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar5;
  }
  this->depthoffset = node->depth + -1;
  return;
}

Assistant:

void HighsSearch::installNode(HighsNodeQueue::OpenNode&& node) {
  localdom.setDomainChangeStack(node.domchgstack, node.branchings);
  bool globalSymmetriesValid = true;
  if (mipsolver.mipdata_->globalOrbits) {
    // if global orbits have been computed we check whether they are still valid
    // in this node
    const auto& domchgstack = localdom.getDomainChangeStack();
    for (HighsInt i : localdom.getBranchingPositions()) {
      HighsInt col = domchgstack[i].column;
      if (mipsolver.mipdata_->symmetries.columnPosition[col] == -1) continue;

      if (!mipsolver.mipdata_->domain.isBinary(col) ||
          (domchgstack[i].boundtype == HighsBoundType::kLower &&
           domchgstack[i].boundval == 1.0)) {
        globalSymmetriesValid = false;
        break;
      }
    }
  }
  nodestack.emplace_back(
      node.lower_bound, node.estimate, nullptr,
      globalSymmetriesValid ? mipsolver.mipdata_->globalOrbits : nullptr);
  subrootsol.clear();
  depthoffset = node.depth - 1;
}